

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommonEx.cpp
# Opt level: O2

uint8_t __thiscall
GmmLib::GmmResourceInfoCommon::GetDisplayCompressionSupport(GmmResourceInfoCommon *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  long *plVar2;
  uint8_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (((this->Surf).Flags.Gpu.field_0x4 & 0x20) == 0) {
    return '\0';
  }
  GVar1 = (this->Surf).Format;
  if ((GVar1 - GMM_FORMAT_R8G8B8A8_SINT < 9) ||
     (((GVar1 < GMM_FORMAT_B10G10R10A2_SINT &&
       ((0xf800100U >> (GVar1 & GMM_FORMAT_B10G10R10A2_UINT) & 1) != 0)) ||
      (GVar1 == GMM_FORMAT_X8B8_UNORM_G8R8_SNORM)))) {
    uVar7 = 1;
  }
  else {
    uVar7 = 0;
  }
  if (((GVar1 - GMM_FORMAT_R10G10B10_FLOAT_A2_UNORM < 10) ||
      (GVar1 - GMM_FORMAT_B10G10R10A2_SINT < 8)) || (GVar1 == GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM)
     ) {
    uVar5 = 1;
  }
  else {
    uVar5 = 0;
  }
  if (((GVar1 - GMM_FORMAT_NV12 < 0x17) &&
      ((0x6a0029U >> (GVar1 - GMM_FORMAT_NV12 & 0x1f) & 1) != 0)) ||
     (GVar1 == GMM_FORMAT_YCRCB_NORMAL)) {
    uVar6 = 1;
  }
  else {
    uVar6 = 0;
  }
  iVar4 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  plVar2 = *(long **)(CONCAT44(extraout_var,iVar4) + 8);
  uVar3 = (**(code **)(*plVar2 + 0x40))
                    (plVar2,&this->Surf,
                     GVar1 == GMM_FORMAT_R16G16B16A16_FLOAT ||
                     GVar1 == GMM_FORMAT_R16G16B16X16_FLOAT,uVar7,uVar5,uVar6);
  return uVar3;
}

Assistant:

uint8_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetDisplayCompressionSupport()
{
    uint8_t             ComprSupported = 0;
    GMM_RESOURCE_FORMAT Format         = Surf.Format;

    if(Surf.Flags.Gpu.UnifiedAuxSurface)
    {
        bool IsSupportedRGB64_16_16_16_16 = false;
        bool IsSupportedRGB32_8_8_8_8     = false;
        bool IsSupportedRGB32_2_10_10_10  = false;
        bool IsSupportedMediaFormats      = false;

        switch(Format) //RGB64 16:16 : 16 : 16 FP16
        {
            case GMM_FORMAT_R16G16B16A16_FLOAT:
            case GMM_FORMAT_R16G16B16X16_FLOAT:
                IsSupportedRGB64_16_16_16_16 = true;
            default:
                break;
        }

        switch(Format) //RGB32 8 : 8 : 8 : 8
        {
            case GMM_FORMAT_B8G8R8A8_UNORM:
            case GMM_FORMAT_R8G8B8A8_UNORM:
            case GMM_FORMAT_B8G8R8X8_UNORM:
            case GMM_FORMAT_R8G8B8X8_UNORM:
            case GMM_FORMAT_R8G8B8A8_UNORM_SRGB:
            case GMM_FORMAT_B8X8_UNORM_G8R8_SNORM:
            case GMM_FORMAT_X8B8_UNORM_G8R8_SNORM:
            case GMM_FORMAT_A8X8_UNORM_G8R8_SNORM:
            case GMM_FORMAT_B8G8R8A8_UNORM_SRGB:
            case GMM_FORMAT_B8G8R8X8_UNORM_SRGB:
            case GMM_FORMAT_R8G8B8A8_SINT:
            case GMM_FORMAT_R8G8B8A8_SNORM:
            case GMM_FORMAT_R8G8B8A8_SSCALED:
            case GMM_FORMAT_R8G8B8A8_UINT:
            case GMM_FORMAT_R8G8B8A8_USCALED:
            case GMM_FORMAT_R8G8B8X8_UNORM_SRGB:
                IsSupportedRGB32_8_8_8_8 = true;
            default:
                break;
        }

        switch(Format) //RGB32 2 : 10 : 10 : 10
        {
            case GMM_FORMAT_B10G10R10X2_UNORM:
            case GMM_FORMAT_R10G10B10A2_UNORM:
            case GMM_FORMAT_B10G10R10A2_UNORM:
            case GMM_FORMAT_B10G10R10A2_SINT:
            case GMM_FORMAT_B10G10R10A2_SNORM:
            case GMM_FORMAT_B10G10R10A2_SSCALED:
            case GMM_FORMAT_B10G10R10A2_UINT:
            case GMM_FORMAT_B10G10R10A2_UNORM_SRGB:
            case GMM_FORMAT_B10G10R10A2_USCALED:
            case GMM_FORMAT_R10G10B10_FLOAT_A2_UNORM:
            case GMM_FORMAT_R10G10B10_SNORM_A2_UNORM:
            case GMM_FORMAT_R10G10B10A2_SINT:
            case GMM_FORMAT_R10G10B10A2_SNORM:
            case GMM_FORMAT_R10G10B10A2_SSCALED:
            case GMM_FORMAT_R10G10B10A2_UINT:
            case GMM_FORMAT_R10G10B10A2_UNORM_SRGB:
            case GMM_FORMAT_R10G10B10A2_USCALED:
            case GMM_FORMAT_R10G10B10X2_USCALED:
            case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
                IsSupportedRGB32_2_10_10_10 = true;
            default:
                break;
        }

        switch(Format)
        {
            case GMM_FORMAT_YUY2: //YUV422 8 bpc
            case GMM_FORMAT_NV12: //YUV420 - NV12
            case GMM_FORMAT_P010: //YUV420 - P0xx
            case GMM_FORMAT_P016:
            case GMM_FORMAT_Y210: //YUV422 - Y210, Y212, Y216
            case GMM_FORMAT_Y216:
            case GMM_FORMAT_Y410: //YUV444 - Y410
            case GMM_FORMAT_Y416:
                IsSupportedMediaFormats = true; //YUV444 - Y412, Y416
            default:
                break;
        }

        //Check fmt is display decompressible
        ComprSupported = GetGmmLibContext()->GetPlatformInfoObj()->CheckFmtDisplayDecompressible(Surf, IsSupportedRGB64_16_16_16_16,
                                                                                                IsSupportedRGB32_8_8_8_8, IsSupportedRGB32_2_10_10_10,
                                                                                                IsSupportedMediaFormats);
    }

    return ComprSupported;
}